

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_facade.cpp
# Opt level: O0

bool __thiscall
EmmyFacade::TcpConnect(EmmyFacade *this,lua_State *L,string *host,int port,string *err)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  dll_lua_pushstring p_Var1;
  bool bVar2;
  element_type *this_01;
  char *pcVar3;
  undefined1 local_50 [7];
  bool suc;
  shared_ptr<SocketClientTransporter> c;
  string *err_local;
  int port_local;
  string *host_local;
  lua_State *L_local;
  EmmyFacade *this_local;
  
  Destroy(this);
  this_00 = &c.super___shared_ptr<SocketClientTransporter,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  EmmyDebuggerManager::AddDebugger
            ((EmmyDebuggerManager *)this_00,(lua_State *)&this->_emmyDebuggerManager);
  std::shared_ptr<Debugger>::~shared_ptr((shared_ptr<Debugger> *)this_00);
  SetReadyHook(this,L);
  std::make_shared<SocketClientTransporter>();
  std::shared_ptr<Transporter>::operator=
            (&this->transporter,(shared_ptr<SocketClientTransporter> *)local_50);
  this_01 = std::
            __shared_ptr_access<SocketClientTransporter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<SocketClientTransporter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_50);
  bVar2 = SocketClientTransporter::Connect(this_01,host,port,err);
  if (bVar2) {
    WaitIDE(this,true,0);
  }
  else {
    (*lua_pushcclosure)(L,LuaError,0);
    p_Var1 = lua_pushstring;
    pcVar3 = (char *)std::__cxx11::string::c_str();
    (*p_Var1)(L,pcVar3);
    lua_call(L,1,0);
  }
  std::shared_ptr<SocketClientTransporter>::~shared_ptr
            ((shared_ptr<SocketClientTransporter> *)local_50);
  return bVar2;
}

Assistant:

bool EmmyFacade::TcpConnect(lua_State *L, const std::string &host, int port, std::string &err) {
	Destroy();

	_emmyDebuggerManager.AddDebugger(L);

	SetReadyHook(L);

	const auto c = std::make_shared<SocketClientTransporter>();
	transporter = c;
	// c->SetHandler(shared_from_this());
	const auto suc = c->Connect(host, port, err);
	if (suc) {
		WaitIDE(true);
	} else {
		lua_pushcfunction(L, LuaError);
		lua_pushstring(L, err.c_str());
		lua_call(L, 1, 0);
	}
	return suc;
}